

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O3

void client_connect(void)

{
  void *pvVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 extraout_RAX;
  code *pcVar5;
  undefined8 *extraout_RDX;
  code *__size;
  code *pcVar6;
  code *pcVar7;
  void *pvVar8;
  undefined8 in_R8;
  undefined8 in_R9;
  sockaddr_in addr;
  undefined8 uVar9;
  undefined1 local_20 [16];
  
  pcVar3 = (code *)malloc(0xf8);
  pcVar4 = (code *)malloc(0x60);
  pcVar6 = (code *)0x194b4a;
  __size = (code *)0x23a3;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_20);
  if (iVar2 == 0) {
    if (pcVar3 == (code *)0x0) goto LAB_0014ddb8;
    if (pcVar4 == (code *)0x0) goto LAB_0014ddbd;
    pcVar6 = (code *)uv_default_loop();
    __size = pcVar3;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_0014ddc2;
    __size = pcVar3;
    pcVar6 = pcVar4;
    iVar2 = uv_tcp_connect(pcVar4,pcVar3,local_20,connect_cb);
    if (iVar2 == 0) {
      return;
    }
  }
  else {
    client_connect_cold_1();
LAB_0014ddb8:
    client_connect_cold_5();
LAB_0014ddbd:
    client_connect_cold_4();
LAB_0014ddc2:
    client_connect_cold_2();
  }
  client_connect_cold_3();
  if ((int)__size == 0) {
    pcVar7 = (code *)0x98;
    uVar9 = extraout_RAX;
    pcVar5 = (code *)malloc(0x98);
    if (pcVar5 == (code *)0x0) goto LAB_0014de2d;
    pcVar7 = (code *)uv_default_loop();
    __size = pcVar5;
    iVar2 = uv_timer_init();
    if (iVar2 != 0) goto LAB_0014de32;
    *(code **)pcVar5 = pcVar6;
    __size = do_accept;
    iVar2 = uv_timer_start(pcVar5,do_accept,1000,0,in_R8,in_R9,uVar9,pcVar3,pcVar4);
    if (iVar2 == 0) {
      connection_cb_called = connection_cb_called + 1;
      return;
    }
  }
  else {
    connection_cb_cold_1();
    pcVar7 = pcVar6;
LAB_0014de2d:
    connection_cb_cold_4();
LAB_0014de32:
    pcVar5 = pcVar7;
    connection_cb_cold_2();
  }
  connection_cb_cold_3();
  pvVar8 = (void *)0xf8;
  pcVar6 = (code *)malloc(0xf8);
  if (pcVar5 == (code *)0x0) {
    do_accept_cold_4();
LAB_0014dec7:
    do_accept_cold_3();
LAB_0014decc:
    do_accept_cold_1();
  }
  else {
    if (pcVar6 == (code *)0x0) goto LAB_0014dec7;
    pvVar8 = (void *)uv_default_loop();
    __size = pcVar6;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_0014decc;
    pvVar1 = *(void **)pcVar5;
    __size = pcVar6;
    pvVar8 = pvVar1;
    iVar2 = uv_accept();
    if (iVar2 == 0) {
      do_accept_called = do_accept_called + 1;
      uv_close(pcVar6,close_cb);
      if (do_accept_called == 2) {
        uv_close(pvVar1,close_cb);
      }
      uv_close(pcVar5,close_cb);
      return;
    }
  }
  do_accept_cold_2();
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  if (pvVar8 == (void *)0x0) {
    connect_cb_cold_3();
  }
  else if ((int)__size == 0) {
    __size = alloc_cb;
    iVar2 = uv_read_start(*(undefined8 *)((long)pvVar8 + 0x48),alloc_cb,read_cb);
    if (iVar2 == 0) {
      connect_cb_called = connect_cb_called + 1;
      free(pvVar8);
      return;
    }
    goto LAB_0014df2f;
  }
  connect_cb_cold_1();
LAB_0014df2f:
  connect_cb_cold_2();
  pvVar8 = malloc((size_t)__size);
  *extraout_RDX = pvVar8;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_tcp_t* client = (uv_tcp_t*)malloc(sizeof *client);
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(client != NULL);
  ASSERT(connect_req != NULL);

  r = uv_tcp_init(uv_default_loop(), client);
  ASSERT(r == 0);

  r = uv_tcp_connect(connect_req,
                     client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);
}